

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateParseTable
          (MessageGenerator *this,Printer *printer,size_t offset,size_t aux_offset)

{
  bool bVar1;
  int iVar2;
  bool bVar3;
  FileOptions_OptimizeMode FVar4;
  char *pcVar5;
  int max_field_number;
  Iterator __begin3;
  Formatter format;
  Iterator __end3;
  int local_94;
  Iterator local_90;
  size_t local_80;
  size_t local_78;
  Formatter local_70;
  Iterator local_38;
  
  local_80 = aux_offset;
  local_78 = offset;
  local_70.printer_ = printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&local_70.vars_._M_t,&(this->variables_)._M_t);
  bVar1 = this->table_driven_;
  if (bVar1 == false) {
    Formatter::operator()<>(&local_70,"{ nullptr, nullptr, 0, -1, -1, -1, -1, nullptr, false },\n");
  }
  else {
    local_94 = 0;
    local_90.descriptor = this->descriptor_;
    local_90.idx = 0;
    local_38.idx = *(int *)(local_90.descriptor + 4);
    local_38.descriptor = local_90.descriptor;
    while( true ) {
      bVar3 = operator==(&local_90,&local_38);
      if (bVar3) break;
      iVar2 = *(int *)(*(long *)(local_90.descriptor + 0x28) + 4 + (long)local_90.idx * 0x48);
      if (local_94 < iVar2) {
        local_94 = iVar2;
      }
      local_90.idx = local_90.idx + 1;
    }
    Formatter::operator()<>(&local_70,"{\n");
    io::Printer::Indent(local_70.printer_);
    Formatter::operator()
              (&local_70,"$tablename$::entries + $1$,\n$tablename$::aux + $2$,\n$3$,\n",&local_78,
               &local_80,&local_94);
    pcVar5 = "PROTOBUF_FIELD_OFFSET($classtype$, _has_bits_),\n";
    if ((this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pcVar5 = "-1,\n";
    }
    Formatter::operator()<>(&local_70,pcVar5);
    pcVar5 = "-1,  // no _oneof_case_\n";
    if (0 < *(int *)(this->descriptor_ + 0x6c)) {
      pcVar5 = "PROTOBUF_FIELD_OFFSET($classtype$, _oneof_case_),\n";
    }
    Formatter::operator()<>(&local_70,pcVar5);
    pcVar5 = "-1,  // no _extensions_\n";
    if (0 < *(int *)(this->descriptor_ + 0x78)) {
      pcVar5 = "PROTOBUF_FIELD_OFFSET($classtype$, _extensions_),\n";
    }
    Formatter::operator()<>(&local_70,pcVar5);
    Formatter::operator()<>
              (&local_70,
               "PROTOBUF_FIELD_OFFSET($classtype$, _internal_metadata_),\n&$package_ns$::_$classname$_default_instance_,\n"
              );
    FVar4 = GetOptimizeFor(*(FileDescriptor **)(this->descriptor_ + 0x10),&this->options_,
                           (bool *)0x0);
    pcVar5 = "true,\n";
    if (FVar4 == FileOptions_OptimizeMode_LITE_RUNTIME) {
      pcVar5 = "false,\n";
    }
    Formatter::operator()<>(&local_70,pcVar5);
    io::Printer::Outdent(local_70.printer_);
    Formatter::operator()<>(&local_70,"},\n");
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_70.vars_._M_t);
  return bVar1;
}

Assistant:

bool MessageGenerator::GenerateParseTable(io::Printer* printer, size_t offset,
                                          size_t aux_offset) {
  Formatter format(printer, variables_);

  if (!table_driven_) {
    format("{ nullptr, nullptr, 0, -1, -1, -1, -1, nullptr, false },\n");
    return false;
  }

  int max_field_number = 0;
  for (auto field : FieldRange(descriptor_)) {
    if (max_field_number < field->number()) {
      max_field_number = field->number();
    }
  }

  format("{\n");
  format.Indent();

  format(
      "$tablename$::entries + $1$,\n"
      "$tablename$::aux + $2$,\n"
      "$3$,\n",
      offset, aux_offset, max_field_number);

  if (has_bit_indices_.empty()) {
    // If no fields have hasbits, then _has_bits_ does not exist.
    format("-1,\n");
  } else {
    format("PROTOBUF_FIELD_OFFSET($classtype$, _has_bits_),\n");
  }

  if (descriptor_->real_oneof_decl_count() > 0) {
    format("PROTOBUF_FIELD_OFFSET($classtype$, _oneof_case_),\n");
  } else {
    format("-1,  // no _oneof_case_\n");
  }

  if (descriptor_->extension_range_count() > 0) {
    format("PROTOBUF_FIELD_OFFSET($classtype$, _extensions_),\n");
  } else {
    format("-1,  // no _extensions_\n");
  }

  // TODO(ckennelly): Consolidate this with the calculation for
  // AuxiliaryParseTableField.
  format(
      "PROTOBUF_FIELD_OFFSET($classtype$, _internal_metadata_),\n"
      "&$package_ns$::_$classname$_default_instance_,\n");

  if (UseUnknownFieldSet(descriptor_->file(), options_)) {
    format("true,\n");
  } else {
    format("false,\n");
  }

  format.Outdent();
  format("},\n");
  return true;
}